

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall
SubprocessTestInterruptParentWithSigHup::SubprocessTestInterruptParentWithSigHup
          (SubprocessTestInterruptParentWithSigHup *this)

{
  SubprocessTestInterruptParentWithSigHup *this_local;
  
  anon_unknown.dwarf_cd35c::SubprocessTest::SubprocessTest(&this->super_SubprocessTest);
  (this->super_SubprocessTest).super_Test._vptr_Test =
       (_func_int **)&PTR__SubprocessTestInterruptParentWithSigHup_002a8e28;
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptParentWithSigHup) {
  Subprocess* subproc = subprocs_.Add("kill -HUP $PPID ; sleep 1");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    bool interrupted = subprocs_.DoWork(NULL);
    if (interrupted)
      return;
  }

  ASSERT_FALSE("We should have been interrupted");
}